

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<unsigned_int&,unsigned_int&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,uint *args,uint *args_1)

{
  ulong uVar1;
  undefined8 in_RCX;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  *vargs;
  remove_reference_t<unsigned_int_&> *in_stack_fffffffffffffef8;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *args_00;
  string *format_str;
  string local_e0 [32];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [12];
  CfdLogLevel local_a4;
  CfdSourceLocation *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_78 [2];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  string *local_30;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  local_c0 = in_R8;
  local_b8 = in_RCX;
  local_a4 = in_ESI;
  local_a0 = in_RDI;
  uVar1 = cfd::core::logger::IsEnableLogLevel(in_ESI);
  if ((uVar1 & 1) != 0) {
    format_str = local_e0;
    local_38 = local_b0;
    local_40 = local_b8;
    local_48 = local_c0;
    args_00 = local_78;
    local_30 = format_str;
    ::fmt::v7::make_args_checked<unsigned_int&,unsigned_int&,char_const*,char>
              ((char **)format_str,(remove_reference_t<unsigned_int_&> *)args_00,
               in_stack_fffffffffffffef8);
    local_50 = args_00;
    local_88 = ::fmt::v7::to_string_view<char,_0>((char *)0x3ce351);
    local_20 = &local_98;
    local_28 = local_50;
    local_18 = local_50;
    local_8 = local_50;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,0x22,local_50);
    ::fmt::v7::detail::vformat_abi_cxx11_
              (format_str,local_88.data_,local_88.size_,local_98.desc_,local_98.field_1.values_);
    cfd::core::logger::WriteLog(local_a0,local_a4,format_str);
    std::__cxx11::string::~string(local_e0);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}